

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_68(QPDF *pdf,char *arg2)

{
  int iVar1;
  ostream *poVar2;
  ulong uVar3;
  void *pvVar4;
  undefined1 local_a8 [8];
  shared_ptr<Buffer> b2;
  shared_ptr<Buffer> b1;
  exception *e;
  allocator<char> local_59;
  string local_58 [32];
  undefined1 local_38 [8];
  QPDFObjectHandle qstream;
  QPDFObjectHandle root;
  char *arg2_local;
  QPDF *pdf_local;
  
  QPDF::getRoot();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,"/QStream",&local_59);
  QPDFObjectHandle::getKey((string *)local_38);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  QPDFObjectHandle::getStreamData((qpdf_stream_decode_level_e)&e);
  std::shared_ptr<Buffer>::~shared_ptr((shared_ptr<Buffer> *)&e);
  poVar2 = std::operator<<((ostream *)&std::cout,"oops -- didn\'t throw");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  QPDFObjectHandle::getStreamData((int)&b2 + 8);
  std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &b2.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  uVar3 = Buffer::getSize();
  if (10 < uVar3) {
    std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &b2.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    pvVar4 = (void *)Buffer::getBuffer();
    iVar1 = memcmp(pvVar4,"wwwwwwwww",9);
    if (iVar1 == 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"filtered stream data okay");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  QPDFObjectHandle::getRawStreamData();
  std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_a8);
  uVar3 = Buffer::getSize();
  if (10 < uVar3) {
    std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_a8);
    pvVar4 = (void *)Buffer::getBuffer();
    iVar1 = memcmp(pvVar4,anon_var_dwarf_1b35c,10);
    if (iVar1 == 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"raw stream data okay");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  std::shared_ptr<Buffer>::~shared_ptr((shared_ptr<Buffer> *)local_a8);
  std::shared_ptr<Buffer>::~shared_ptr
            ((shared_ptr<Buffer> *)
             &b2.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_38);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &qstream.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

static void
test_68(QPDF& pdf, char const* arg2)
{
    QPDFObjectHandle root = pdf.getRoot();
    QPDFObjectHandle qstream = root.getKey("/QStream");
    try {
        qstream.getStreamData();
        std::cout << "oops -- didn't throw" << std::endl;
    } catch (std::exception& e) {
        std::cout << "get unfilterable stream: " << e.what() << std::endl;
    }
    std::shared_ptr<Buffer> b1 = qstream.getStreamData(qpdf_dl_all);
    if ((b1->getSize() > 10) && (memcmp(b1->getBuffer(), "wwwwwwwww", 9) == 0)) {
        std::cout << "filtered stream data okay" << std::endl;
    }
    std::shared_ptr<Buffer> b2 = qstream.getRawStreamData();
    if ((b2->getSize() > 10) &&
        (memcmp(b2->getBuffer(), "\xff\xd8\xff\xe0\x00\x10\x4a\x46\x49\x46", 10) == 0)) {
        std::cout << "raw stream data okay" << std::endl;
    }
}